

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O3

ChannelType glu::mapGLChannelType(deUint32 dataType,bool normalized)

{
  ChannelType CVar1;
  ChannelType CVar2;
  
  if ((int)dataType < 0x8033) {
    switch(dataType) {
    case 0x1400:
      CVar2 = SNORM_INT8;
      CVar1 = SIGNED_INT8;
      break;
    case 0x1401:
      CVar2 = UNORM_INT8;
      CVar1 = UNSIGNED_INT8;
      break;
    case 0x1402:
      CVar2 = SNORM_INT16;
      CVar1 = SIGNED_INT16;
      break;
    case 0x1403:
      CVar2 = UNORM_INT16;
      CVar1 = UNSIGNED_INT16;
      break;
    case 0x1404:
      CVar2 = SNORM_INT32;
      CVar1 = SIGNED_INT32;
      break;
    case 0x1405:
      CVar2 = UNORM_INT32;
      CVar1 = UNSIGNED_INT32;
      break;
    case 0x1406:
      return FLOAT;
    default:
      goto switchD_00a17a15_caseD_1407;
    case 0x140b:
      return HALF_FLOAT;
    }
LAB_00a17b06:
    if (normalized) {
      CVar1 = CVar2;
    }
    return CVar1;
  }
  if ((int)dataType < 0x84fa) {
    if ((int)dataType < 0x8363) {
      if (dataType == 0x8033) {
        return UNORM_SHORT_4444;
      }
      if (dataType == 0x8034) {
        return UNORM_SHORT_5551;
      }
    }
    else {
      if (dataType == 0x8363) {
        return UNORM_SHORT_565;
      }
      if (dataType == 0x8368) {
        CVar2 = UNORM_INT_1010102_REV;
        CVar1 = UNSIGNED_INT_1010102_REV;
        goto LAB_00a17b06;
      }
    }
  }
  else if ((int)dataType < 0x8c3e) {
    if (dataType == 0x84fa) {
      return UNSIGNED_INT_24_8;
    }
    if (dataType == 0x8c3b) {
      return UNSIGNED_INT_11F_11F_10F_REV;
    }
  }
  else {
    if (dataType == 0x8c3e) {
      return UNSIGNED_INT_999_E5_REV;
    }
    if (dataType == 0x8dad) {
      return FLOAT_UNSIGNED_INT_24_8_REV;
    }
  }
switchD_00a17a15_caseD_1407:
  return CHANNELTYPE_LAST;
}

Assistant:

static tcu::TextureFormat::ChannelType mapGLChannelType (deUint32 dataType, bool normalized)
{
	// \note Normalized bit is ignored where it doesn't apply.
	using tcu::TextureFormat;

	switch (dataType)
	{
		case GL_UNSIGNED_BYTE:					return normalized ? TextureFormat::UNORM_INT8	: TextureFormat::UNSIGNED_INT8;
		case GL_BYTE:							return normalized ? TextureFormat::SNORM_INT8	: TextureFormat::SIGNED_INT8;
		case GL_UNSIGNED_SHORT:					return normalized ? TextureFormat::UNORM_INT16	: TextureFormat::UNSIGNED_INT16;
		case GL_SHORT:							return normalized ? TextureFormat::SNORM_INT16	: TextureFormat::SIGNED_INT16;
		case GL_UNSIGNED_INT:					return normalized ? TextureFormat::UNORM_INT32	: TextureFormat::UNSIGNED_INT32;
		case GL_INT:							return normalized ? TextureFormat::SNORM_INT32	: TextureFormat::SIGNED_INT32;
		case GL_FLOAT:							return TextureFormat::FLOAT;
		case GL_UNSIGNED_SHORT_4_4_4_4:			return TextureFormat::UNORM_SHORT_4444;
		case GL_UNSIGNED_SHORT_5_5_5_1:			return TextureFormat::UNORM_SHORT_5551;
		case GL_UNSIGNED_SHORT_5_6_5:			return TextureFormat::UNORM_SHORT_565;
		case GL_HALF_FLOAT:						return TextureFormat::HALF_FLOAT;
		case GL_UNSIGNED_INT_2_10_10_10_REV:	return normalized ? TextureFormat::UNORM_INT_1010102_REV : TextureFormat::UNSIGNED_INT_1010102_REV;
		case GL_UNSIGNED_INT_10F_11F_11F_REV:	return TextureFormat::UNSIGNED_INT_11F_11F_10F_REV;
		case GL_UNSIGNED_INT_24_8:				return TextureFormat::UNSIGNED_INT_24_8;
		case GL_FLOAT_32_UNSIGNED_INT_24_8_REV:	return TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV;
		case GL_UNSIGNED_INT_5_9_9_9_REV:		return TextureFormat::UNSIGNED_INT_999_E5_REV;

		default:
			DE_ASSERT(false);
			return TextureFormat::CHANNELTYPE_LAST;
	}
}